

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::_::DebugComparison<capnp::DynamicValue::Type_const&,capnp::DynamicValue::Type>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *params)

{
  DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *this_00;
  DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *value;
  String local_30;
  kj *local_18;
  DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *params_local;
  
  local_18 = this;
  params_local = (DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)
                 __return_storage_ptr__;
  this_00 = fwd<kj::_::DebugComparison<capnp::DynamicValue::Type_const&,capnp::DynamicValue::Type>&>
                      ((DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type>
                        *)this);
  toCharSequence<kj::_::DebugComparison<capnp::DynamicValue::Type_const&,capnp::DynamicValue::Type>&>
            (&local_30,(kj *)this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}